

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void many_handshakes(void)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  ptls_t *tls;
  anon_struct_24_3_a6ccebed *paVar4;
  ptls_t *ppVar5;
  ptls_cipher_suite_t *ppVar6;
  long lVar7;
  size_t local_2198;
  size_t local_2190;
  size_t resplen;
  size_t i_2;
  size_t i_1;
  undefined1 *puStack_2170;
  int nfds;
  fd_set *__arr;
  undefined1 local_2160 [4];
  uint __i;
  fd_set rfds;
  ptls_async_job_t *job;
  size_t sStack_20d0;
  int hsret;
  size_t inlen;
  uint8_t hsbuf_small [8192];
  undefined1 local_c0 [8];
  ptls_buffer_t hsbuf;
  size_t offending;
  size_t num_running;
  size_t num_issued;
  timeval end;
  timeval start;
  size_t i;
  undefined1 auStack_58 [4];
  int ret;
  ptls_buffer_t resp_sample;
  ptls_buffer_t clientbuf;
  ptls_t *resp_sample_conn;
  ptls_t *client;
  
  tls = ptls_new(ctx,0);
  clientbuf.is_allocated = '\0';
  clientbuf.align_bits = '\0';
  clientbuf._26_6_ = 0;
  ptls_buffer_init((ptls_buffer_t *)&resp_sample.is_allocated,"",0);
  iVar2 = ptls_handshake(tls,(ptls_buffer_t *)&resp_sample.is_allocated,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar2 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x1a3);
  ptls_buffer_init((ptls_buffer_t *)auStack_58,"",0);
  qat.first_pending = 0;
  for (start.tv_usec = 0; (ulong)start.tv_usec < 10; start.tv_usec = start.tv_usec + 1) {
    qat.conns[start.tv_usec].next_pending = start.tv_usec + 1;
    qat.conns[start.tv_usec].tls = (ptls_t *)0x0;
    qat.conns[start.tv_usec].wait_fd = -1;
  }
  qat.conns[9].next_pending = 0xffffffffffffffff;
  gettimeofday((timeval *)&end.tv_usec,(__timezone_ptr_t)0x0);
  num_running = 0;
  offending = 0;
  while( true ) {
    while (sVar1 = qat.first_pending, qat.first_pending == 0xffffffffffffffff) {
      if (offending == 0) {
        gettimeofday((timeval *)&num_issued,(__timezone_ptr_t)0x0);
        note("run %zu handshakes in %f seconds",
             ((double)(long)num_issued + (double)end.tv_sec / 1000000.0) -
             ((double)end.tv_usec + (double)start.tv_sec / 1000000.0),10000);
        local_2190 = resp_sample.capacity;
        iVar2 = ptls_handshake(tls,(ptls_buffer_t *)&resp_sample.is_allocated,_auStack_58,
                               &local_2190,(ptls_handshake_properties_t *)0x0);
        _ok((uint)(iVar2 == 0),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x203);
        ptls_buffer_dispose((ptls_buffer_t *)&resp_sample.is_allocated);
        ptls_buffer_dispose((ptls_buffer_t *)auStack_58);
        ptls_free(tls);
        return;
      }
      puStack_2170 = local_2160;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        *(undefined8 *)(puStack_2170 + (ulong)__arr._4_4_ * 8) = 0;
      }
      i_1._4_4_ = 0;
      for (i_2 = 0; i_2 < 10; i_2 = i_2 + 1) {
        if ((qat.conns[i_2].wait_fd != -1) &&
           (lVar7 = (long)(qat.conns[i_2].wait_fd / 0x40),
           *(ulong *)(local_2160 + lVar7 * 8) =
                1L << ((byte)((long)qat.conns[i_2].wait_fd % 0x40) & 0x3f) |
                *(ulong *)(local_2160 + lVar7 * 8), i_1._4_4_ <= qat.conns[i_2].wait_fd)) {
          i_1._4_4_ = qat.conns[i_2].wait_fd + 1;
        }
      }
      iVar2 = select(i_1._4_4_,(fd_set *)local_2160,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (0 < iVar2) {
        for (resplen = 0; resplen < 10; resplen = resplen + 1) {
          if ((qat.conns[resplen].wait_fd != -1) &&
             ((*(ulong *)(local_2160 + (long)(qat.conns[resplen].wait_fd / 0x40) * 8) &
              1L << ((byte)((long)qat.conns[resplen].wait_fd % 0x40) & 0x3f)) != 0)) {
            qat.conns[resplen].wait_fd = -1;
            qat_set_pending(resplen);
          }
        }
      }
    }
    hsbuf.is_allocated = (undefined1)qat.first_pending;
    hsbuf.align_bits = qat.first_pending._1_1_;
    hsbuf._26_6_ = qat.first_pending._2_6_;
    paVar4 = qat.conns + qat.first_pending;
    qat.first_pending = qat.conns[qat.first_pending].next_pending;
    paVar4->next_pending = 0xffffffffffffffff;
    if (qat.conns[sVar1].tls == (ptls_t *)0x0) {
      ppVar5 = ptls_new(ctx_peer,1);
      qat.conns[hsbuf._24_8_].tls = ppVar5;
      if (clientbuf._24_8_ == 0) {
        clientbuf._24_8_ = qat.conns[hsbuf._24_8_].tls;
      }
      num_running = num_running + 1;
      offending = offending + 1;
    }
    ptls_buffer_init((ptls_buffer_t *)local_c0,&inlen,0x2000);
    ppVar6 = ptls_get_cipher(qat.conns[hsbuf._24_8_].tls);
    if (ppVar6 == (ptls_cipher_suite_t *)0x0) {
      local_2198 = clientbuf.capacity;
    }
    else {
      local_2198 = 0;
    }
    sStack_20d0 = local_2198;
    uVar3 = ptls_handshake(qat.conns[hsbuf._24_8_].tls,(ptls_buffer_t *)local_c0,
                           (void *)resp_sample._24_8_,&stack0xffffffffffffdf30,
                           (ptls_handshake_properties_t *)0x0);
    if (((ptls_t *)clientbuf._24_8_ == qat.conns[hsbuf._24_8_].tls) &&
       (iVar2 = ptls_buffer__do_pushv((ptls_buffer_t *)auStack_58,(void *)local_c0,hsbuf.capacity),
       iVar2 != 0)) break;
    ptls_buffer_dispose((ptls_buffer_t *)local_c0);
    if (uVar3 == 0) {
      if (qat.conns[hsbuf._24_8_].tls == (ptls_t *)clientbuf._24_8_) {
        clientbuf.is_allocated = '\x01';
        clientbuf.align_bits = '\0';
        clientbuf._26_6_ = 0;
      }
      ptls_free(qat.conns[hsbuf._24_8_].tls);
      qat.conns[hsbuf._24_8_].tls = (ptls_t *)0x0;
      offending = offending - 1;
      if (num_running < 10000) {
        qat_set_pending(hsbuf._24_8_);
      }
    }
    else {
      if (uVar3 != 0x20b) {
        fprintf(_stderr,"ptls_handshake returned %d\n",(ulong)uVar3);
        abort();
      }
      rfds.fds_bits[0xf] = (__fd_mask)ptls_get_async_job(qat.conns[hsbuf._24_8_].tls);
      if (((ptls_async_job_t *)rfds.fds_bits[0xf])->get_fd ==
          (_func_int_st_ptls_async_job_t_ptr *)0x0) {
        __assert_fail("job->get_fd != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                      0x1d9,"void many_handshakes(void)");
      }
      iVar2 = (*((ptls_async_job_t *)rfds.fds_bits[0xf])->get_fd)
                        ((st_ptls_async_job_t *)rfds.fds_bits[0xf]);
      qat.conns[hsbuf._24_8_].wait_fd = iVar2;
      if (qat.conns[hsbuf._24_8_].wait_fd == -1) {
        __assert_fail("qat.conns[offending].wait_fd != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                      0x1db,"void many_handshakes(void)");
      }
    }
  }
  return;
}

Assistant:

static void many_handshakes(void)
{
    ptls_t *client = ptls_new(ctx, 0), *resp_sample_conn = NULL;
    ptls_buffer_t clientbuf, resp_sample;
    int ret;

    { /* generate ClientHello that we would be sent to all the server-side objects */
        ptls_buffer_init(&clientbuf, "", 0);
        ret = ptls_handshake(client, &clientbuf, NULL, NULL, NULL);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    }

    ptls_buffer_init(&resp_sample, "", 0);

    qat.first_pending = 0;
    for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
        qat.conns[i].next_pending = i + 1;
        qat.conns[i].tls = NULL;
        qat.conns[i].wait_fd = -1;
    }
    qat.conns[PTLS_ELEMENTSOF(qat.conns) - 1].next_pending = SIZE_MAX;

    struct timeval start, end;
    gettimeofday(&start, NULL);

    static const size_t num_total = 10000;
    size_t num_issued = 0, num_running = 0;
    while (1) {
        while (qat.first_pending != SIZE_MAX) {
            size_t offending = qat.first_pending;
            /* detach the offending entry from pending list */
            qat.first_pending = qat.conns[offending].next_pending;
            qat.conns[offending].next_pending = SIZE_MAX;
            /* run the offending entry */
            if (qat.conns[offending].tls == NULL) {
                qat.conns[offending].tls = ptls_new(ctx_peer, 1);
                if (resp_sample_conn == NULL)
                    resp_sample_conn = qat.conns[offending].tls;
                ++num_issued;
                ++num_running;
            }
            ptls_buffer_t hsbuf;
            uint8_t hsbuf_small[8192];
            ptls_buffer_init(&hsbuf, hsbuf_small, sizeof(hsbuf_small));
            size_t inlen = ptls_get_cipher(qat.conns[offending].tls) == NULL ? clientbuf.off : 0; /* feed CH only as first flight */
            int hsret = ptls_handshake(qat.conns[offending].tls, &hsbuf, clientbuf.base, &inlen, NULL);
            if (resp_sample_conn == qat.conns[offending].tls) {
                ptls_buffer_pushv(&resp_sample, hsbuf.base, hsbuf.off);
            }
            ptls_buffer_dispose(&hsbuf);
            /* advance the handshake context */
            switch (hsret) {
            case 0:
                if (qat.conns[offending].tls == resp_sample_conn)
                    resp_sample_conn = (void *)1;
                ptls_free(qat.conns[offending].tls);
                qat.conns[offending].tls = NULL;
                --num_running;
                if (num_issued < num_total)
                    qat_set_pending(offending);
                break;
            case PTLS_ERROR_ASYNC_OPERATION: {
                ptls_async_job_t *job = ptls_get_async_job(qat.conns[offending].tls);
                assert(job->get_fd != NULL);
                qat.conns[offending].wait_fd = job->get_fd(job);
                assert(qat.conns[offending].wait_fd != -1);
            } break;
            default:
                fprintf(stderr, "ptls_handshake returned %d\n", hsret);
                abort();
                break;
            }
        }
        if (num_running == 0)
            break;
        /* poll for next action */
        fd_set rfds;
        FD_ZERO(&rfds);
        int nfds = 0;
        for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
            if (qat.conns[i].wait_fd != -1) {
                FD_SET(qat.conns[i].wait_fd, &rfds);
                if (nfds <= qat.conns[i].wait_fd)
                    nfds = qat.conns[i].wait_fd + 1;
            }
        }
        if (select(nfds, &rfds, NULL, NULL, NULL) > 0) {
            for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
                if (qat.conns[i].wait_fd != -1 && FD_ISSET(qat.conns[i].wait_fd, &rfds)) {
                    qat.conns[i].wait_fd = -1;
                    qat_set_pending(i);
                }
            }
        }
    }

    gettimeofday(&end, NULL);

    note("run %zu handshakes in %f seconds", num_total,
         (end.tv_sec + end.tv_usec / 1000000.) - (start.tv_sec + start.tv_usec / 1000000.));

    clientbuf.off = 0;

    /* confirm that the response looks okay */
    size_t resplen = resp_sample.off;
    ok(ptls_handshake(client, &clientbuf, resp_sample.base, &resplen, NULL) == 0);

    ptls_buffer_dispose(&clientbuf);
    ptls_buffer_dispose(&resp_sample);
    ptls_free(client);

    return;
Exit:
    assert("unreachable");
}